

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

void diy::
     Serialization<std::vector<diy::io::detail::GidOffsetCount,_std::allocator<diy::io::detail::GidOffsetCount>_>_>
     ::load(BinaryBuffer *bb,Vector *v)

{
  size_t s;
  size_type local_38;
  value_type local_30;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&local_38,8);
  local_30.gid = -1;
  local_30.offset = 0;
  local_30.count = 0;
  std::vector<diy::io::detail::GidOffsetCount,_std::allocator<diy::io::detail::GidOffsetCount>_>::
  resize(v,local_38,&local_30);
  if (local_38 != 0) {
    load<diy::io::detail::GidOffsetCount>
              (bb,(v->
                  super__Vector_base<diy::io::detail::GidOffsetCount,_std::allocator<diy::io::detail::GidOffsetCount>_>
                  )._M_impl.super__Vector_impl_data._M_start,local_38);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }